

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O0

void crnlib::LenEnc_SetPrices
               (CLenEnc *p,UInt32 posState,UInt32 numSymbols,UInt32 *prices,UInt32 *ProbPrices)

{
  UInt32 UVar1;
  UInt32 UVar2;
  UInt32 UVar3;
  UInt32 UVar4;
  UInt32 UVar5;
  uint local_3c;
  UInt32 i;
  UInt32 b1;
  UInt32 b0;
  UInt32 a1;
  UInt32 a0;
  UInt32 *ProbPrices_local;
  UInt32 *prices_local;
  UInt32 numSymbols_local;
  UInt32 posState_local;
  CLenEnc *p_local;
  
  UVar5 = ProbPrices[(int)(uint)p->choice >> 4];
  UVar1 = ProbPrices[(int)(p->choice ^ 0x7ff) >> 4];
  UVar2 = ProbPrices[(int)(uint)p->choice2 >> 4];
  UVar3 = ProbPrices[(int)(p->choice2 ^ 0x7ff) >> 4];
  for (local_3c = 0; local_3c < 8; local_3c = local_3c + 1) {
    if (numSymbols <= local_3c) {
      return;
    }
    UVar4 = RcTree_GetPrice(p->low + (posState << 3),3,local_3c,ProbPrices);
    prices[local_3c] = UVar5 + UVar4;
  }
  while( true ) {
    if (0xf < local_3c) {
      for (; local_3c < numSymbols; local_3c = local_3c + 1) {
        UVar5 = RcTree_GetPrice(p->high,8,local_3c - 0x10,ProbPrices);
        prices[local_3c] = UVar1 + UVar3 + UVar5;
      }
      return;
    }
    if (numSymbols <= local_3c) break;
    UVar5 = RcTree_GetPrice(p->mid + (posState << 3),3,local_3c - 8,ProbPrices);
    prices[local_3c] = UVar1 + UVar2 + UVar5;
    local_3c = local_3c + 1;
  }
  return;
}

Assistant:

static void LenEnc_SetPrices(CLenEnc* p, UInt32 posState, UInt32 numSymbols, UInt32* prices, UInt32* ProbPrices) {
  UInt32 a0 = GET_PRICE_0a(p->choice);
  UInt32 a1 = GET_PRICE_1a(p->choice);
  UInt32 b0 = a1 + GET_PRICE_0a(p->choice2);
  UInt32 b1 = a1 + GET_PRICE_1a(p->choice2);
  UInt32 i = 0;
  for (i = 0; i < kLenNumLowSymbols; i++) {
    if (i >= numSymbols)
      return;
    prices[i] = a0 + RcTree_GetPrice(p->low + (posState << kLenNumLowBits), kLenNumLowBits, i, ProbPrices);
  }
  for (; i < kLenNumLowSymbols + kLenNumMidSymbols; i++) {
    if (i >= numSymbols)
      return;
    prices[i] = b0 + RcTree_GetPrice(p->mid + (posState << kLenNumMidBits), kLenNumMidBits, i - kLenNumLowSymbols, ProbPrices);
  }
  for (; i < numSymbols; i++)
    prices[i] = b1 + RcTree_GetPrice(p->high, kLenNumHighBits, i - kLenNumLowSymbols - kLenNumMidSymbols, ProbPrices);
}